

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::AppendRowGroup(RowGroupCollection *this,SegmentLock *l,idx_t start_row)

{
  pointer this_00;
  RowGroupSegmentTree *this_01;
  templated_unique_single_t new_row_group;
  __uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> local_38;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_30;
  uint local_24;
  idx_t local_20;
  
  local_24 = 0;
  local_20 = start_row;
  make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,unsigned_int>
            ((duckdb *)&local_38,this,&local_20,&local_24);
  this_00 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                      ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                       &local_38);
  RowGroup::InitializeEmpty(this_00,&this->types);
  this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_30._M_head_impl =
       (RowGroup *)
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
       super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  local_38._M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (tuple<duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)
       (_Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)0x0;
  SegmentTree<duckdb::RowGroup,_true>::AppendSegment
            (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,l,
             (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)&local_30)
  ;
  ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_30);
  ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_38);
  return;
}

Assistant:

void RowGroupCollection::AppendRowGroup(SegmentLock &l, idx_t start_row) {
	D_ASSERT(start_row >= row_start);
	auto new_row_group = make_uniq<RowGroup>(*this, start_row, 0U);
	new_row_group->InitializeEmpty(types);
	row_groups->AppendSegment(l, std::move(new_row_group));
}